

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O2

varinfo * varinfo_new(vardata *data)

{
  uint uVar1;
  varinfo *pvVar2;
  uint32_t *puVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pvVar2 = (varinfo *)calloc(0x20,1);
  pvVar2->data = data;
  puVar3 = (uint32_t *)calloc(4,(long)((data->featuresnum + 0x1f) / 0x20));
  pvVar2->fmask = puVar3;
  uVar1 = data->varsetsnum;
  piVar4 = (int *)calloc(4,(long)(int)uVar1);
  pvVar2->variants = piVar4;
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    piVar4[uVar5] = -1;
  }
  uVar1 = data->modesetsnum;
  piVar4 = (int *)calloc(4,(long)(int)uVar1);
  pvVar2->modes = piVar4;
  lVar6 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 * 6 - lVar6 != 0; lVar6 = lVar6 + 6) {
    *piVar4 = (&data->modesets->defmode)[lVar6];
    piVar4 = piVar4 + 1;
  }
  return pvVar2;
}

Assistant:

struct varinfo *varinfo_new(struct vardata *data) {
	struct varinfo *res = calloc(sizeof *res, 1);
	int i;
	res->data = data;
	res->fmask = mask_new(data->featuresnum);
	res->variants = calloc(sizeof *res->variants, data->varsetsnum);
	for (i = 0; i < data->varsetsnum; i++)
		res->variants[i] = -1;
	res->modes = calloc(sizeof *res->modes, data->modesetsnum);
	for (i = 0; i < data->modesetsnum; i++)
		res->modes[i] = data->modesets[i].defmode;
	return res;
}